

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::TextureSizeCase::testTextureSize(TextureSizeCase *this,TestSize *testSize)

{
  int *value;
  ostringstream *poVar1;
  int iVar2;
  TextureType TVar3;
  RenderContext *context;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  GLenum GVar11;
  undefined4 extraout_var;
  MessageBuilder *pMVar13;
  OutOfMemoryError *this_00;
  byte bVar14;
  int iVar15;
  int *value_00;
  int iVar16;
  bool bVar17;
  GLuint texId;
  Vec4 outputColor;
  TextureLevel sample;
  ConstPixelBufferAccess local_1f8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [384];
  long lVar12;
  
  local_1f8.m_size.m_data[2] = -0x40800000;
  local_1f8.m_pitch.m_data[0] = -0x40800000;
  local_1f8.m_pitch.m_data[1] = 0;
  local_1f8.m_pitch.m_data[2] = 0x3f800000;
  local_1f8.m_data = (void *)0xbf80000040800000;
  uStack_1d0 = 0x3f80000000000000;
  local_1c8 = 0xbf800000;
  uStack_1c4 = 0x40800000;
  uStack_1c0 = 0;
  uStack_1bc = 0x3f800000;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar6);
  uVar7 = (**(code **)(lVar12 + 0x780))((this->m_program->m_program).m_program,"a_position");
  uVar8 = (**(code **)(lVar12 + 0xb48))((this->m_program->m_program).m_program,"u_sampler");
  uVar9 = (**(code **)(lVar12 + 0xb48))((this->m_program->m_program).m_program,"u_texSize");
  uVar10 = (**(code **)(lVar12 + 0xb48))((this->m_program->m_program).m_program,"u_lod");
  GVar11 = getGLTextureTarget(this);
  iVar6 = (testSize->textureSize).m_data[0];
  iVar2 = (testSize->textureSize).m_data[1];
  bVar14 = (char)testSize->lodBase + (char)testSize->lod;
  iVar15 = iVar6 >> (bVar14 & 0x1f);
  iVar16 = iVar2 >> (bVar14 & 0x1f);
  TVar3 = (this->m_textureSpec).type;
  bVar17 = true;
  if ((TVar3 != TEXTURETYPE_2D_ARRAY || (iVar16 != 0 || iVar15 != 0)) &&
      ((TVar3 != TEXTURETYPE_2D || (iVar16 != 0 || iVar15 != 0)) &&
      (TVar3 != TEXTURETYPE_CUBE_MAP || iVar6 == iVar2))) {
    value = &testSize->lod;
    value_00 = &testSize->lodBase;
    (**(code **)(lVar12 + 0x1680))((this->m_program->m_program).m_program);
    (**(code **)(lVar12 + 0x14f0))(uVar8,0);
    (**(code **)(lVar12 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f800000);
    (**(code **)(lVar12 + 0x1a00))(0,0,1);
    (**(code **)(lVar12 + 0x19f0))(uVar7,4,0x1406,0,0,local_1f8.m_size.m_data + 2);
    (**(code **)(lVar12 + 0x610))(uVar7);
    iVar6 = *value + *value_00 + 1;
    texId = 0;
    (**(code **)(lVar12 + 0x6f8))(1,&texId);
    (**(code **)(lVar12 + 0xb8))(GVar11,texId);
    (**(code **)(lVar12 + 0x1360))(GVar11,0x2801,0x2600);
    (**(code **)(lVar12 + 0x1360))(GVar11,0x2800,0x2600);
    (**(code **)(lVar12 + 0x1360))(GVar11,0x813c,*value_00);
    TVar3 = (this->m_textureSpec).type;
    if (TVar3 < TEXTURETYPE_2D_ARRAY) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Testing image size ");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[1]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Lod: ");
      pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar13->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", base level: ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value_00);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Expecting: ");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[1]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar12 + 0x1538))(uVar9,1,&testSize->expectedSize);
      (**(code **)(lVar12 + 0x14f8))(uVar10,1,value);
      (**(code **)(lVar12 + 0x1380))
                (GVar11,iVar6,(this->m_textureSpec).format,(testSize->textureSize).m_data[0],
                 (testSize->textureSize).m_data[1]);
    }
    else if (TVar3 == TEXTURETYPE_2D_ARRAY) {
      sample.m_size.m_data[0] = (testSize->textureSize).m_data[2];
      sample.m_format.order = (testSize->expectedSize).m_data[0];
      sample.m_format.type = (testSize->expectedSize).m_data[1];
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Testing image size ");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[1]);
      std::operator<<((ostream *)poVar1," with ");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[2]);
      std::operator<<((ostream *)poVar1," layer(s)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Lod: ");
      pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar13->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", base level: ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value_00);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Expecting: ");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[1]);
      std::operator<<((ostream *)poVar1," and ");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[2]);
      std::operator<<((ostream *)poVar1," layer(s)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar12 + 0x1578))(uVar9,1,&sample);
      (**(code **)(lVar12 + 0x14f8))(uVar10,1,value);
      (**(code **)(lVar12 + 0x1398))
                (GVar11,iVar6,(this->m_textureSpec).format,(testSize->textureSize).m_data[0],
                 (testSize->textureSize).m_data[1],(testSize->textureSize).m_data[2]);
    }
    else if (TVar3 == TEXTURETYPE_3D) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Testing image size ");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[1]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->textureSize).m_data[2]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Lod: ");
      pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      std::operator<<(&(pMVar13->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      ", base level: ");
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,value_00);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Expecting: ");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[0]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[1]);
      std::operator<<((ostream *)poVar1,"x");
      std::ostream::operator<<(poVar1,(testSize->expectedSize).m_data[2]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar12 + 0x1578))(uVar9,1,&testSize->expectedSize);
      (**(code **)(lVar12 + 0x14f8))(uVar10,1,value);
      (**(code **)(lVar12 + 0x1398))
                (GVar11,iVar6,(this->m_textureSpec).format,(testSize->textureSize).m_data[0],
                 (testSize->textureSize).m_data[1],(testSize->textureSize).m_data[2]);
    }
    iVar6 = (**(code **)(lVar12 + 0x800))();
    if (iVar6 == 0) {
      local_1b0._0_4_ = RGBA;
      local_1b0._4_4_ = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&sample,(TextureFormat *)local_1b0,1,1,1);
      tcu::Vector<float,_4>::Vector(&outputColor);
      (**(code **)(lVar12 + 0x188))(0x4000);
      (**(code **)(lVar12 + 0x538))(4,0,3);
      (**(code **)(lVar12 + 0x648))();
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&sample);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&sample);
      tcu::ConstPixelBufferAccess::getPixel(&local_1f8,(int)local_1b0,0,0);
      outputColor.m_data[0] = (float)local_1f8.m_format.order;
      outputColor.m_data[1] = (float)local_1f8.m_format.type;
      uVar4 = outputColor.m_data._0_8_;
      outputColor.m_data[2] = (float)local_1f8.m_size.m_data[0];
      outputColor.m_data[3] = (float)local_1f8.m_size.m_data[1];
      uVar5 = outputColor.m_data._8_8_;
      outputColor.m_data[1] = (float)local_1f8.m_format.type;
      outputColor.m_data[0] = (float)local_1f8.m_format.order;
      outputColor.m_data[2] = local_1f8.m_size.m_data[0];
      bVar17 = (bool)(0.9 <= outputColor.m_data[2] &
                     -(0.9 <= outputColor.m_data[1]) & -(0.9 <= outputColor.m_data[0]));
      outputColor.m_data._0_8_ = uVar4;
      outputColor.m_data._8_8_ = uVar5;
      if (bVar17 == true) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Passed");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Failed");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      tcu::TextureLevel::~TextureLevel(&sample);
    }
    else {
      if (iVar6 == 0x505) {
        this_00 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
        glu::OutOfMemoryError::OutOfMemoryError
                  (this_00,"Failed to allocate texture, got GL_OUT_OF_MEMORY.","TexStorageXD",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderTextureFunctionTests.cpp"
                   ,0x4be);
        __cxa_throw(this_00,&glu::OutOfMemoryError::typeinfo,
                    glu::OutOfMemoryError::~OutOfMemoryError);
      }
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Failed, got ");
      sample.m_format = (TextureFormat)glu::getErrorName;
      sample.m_size.m_data[0] = iVar6;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&sample,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,".");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar17 = false;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    (**(code **)(lVar12 + 0xb8))(GVar11,0);
    (**(code **)(lVar12 + 0x480))(1,&texId);
    (**(code **)(lVar12 + 0x1680))(0);
  }
  return bVar17;
}

Assistant:

bool TextureSizeCase::testTextureSize (const TestSize& testSize)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[3] = // covers entire viewport
	{
		tcu::Vec4(-1, -1, 0, 1),
		tcu::Vec4( 4, -1, 0, 1),
		tcu::Vec4(-1,  4, 0, 1),
	};

	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	const glw::GLint		positionLoc		= gl.getAttribLocation	(m_program->getProgram(), "a_position");
	const glw::GLint		samplerLoc		= gl.getUniformLocation	(m_program->getProgram(), "u_sampler");
	const glw::GLint		sizeLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_texSize");
	const glw::GLint		lodLoc			= gl.getUniformLocation	(m_program->getProgram(), "u_lod");
	const glw::GLenum		textureTarget	= getGLTextureTarget	();
	const bool				isSquare		= testSize.textureSize.x() == testSize.textureSize.y();
	const bool				is2DLodValid	= (testSize.textureSize.x() >> (testSize.lod + testSize.lodBase)) != 0 || (testSize.textureSize.y() >> (testSize.lod + testSize.lodBase)) != 0;
	bool					success			= true;
	glw::GLenum				errorValue;

	// Skip incompatible cases
	if (m_textureSpec.type == TEXTURETYPE_CUBE_MAP && !isSquare)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D && !is2DLodValid)
		return true;
	if (m_textureSpec.type == TEXTURETYPE_2D_ARRAY && !is2DLodValid)
		return true;

	// setup rendering

	gl.useProgram				(m_program->getProgram());
	gl.uniform1i				(samplerLoc, 0);
	gl.clearColor				(0.5f, 0.5f, 0.5f, 1.0f);
	gl.viewport					(0, 0, 1, 1);
	gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);
	gl.enableVertexAttribArray	(positionLoc);

	// setup texture
	{
		const int	maxLevel	= testSize.lod + testSize.lodBase;
		const int	levels		= maxLevel + 1;
		glw::GLuint texId		= 0;

		// gen texture
		gl.genTextures(1, &texId);
		gl.bindTexture(textureTarget, texId);
		gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(textureTarget, GL_TEXTURE_BASE_LEVEL, testSize.lodBase);

		// set up texture

		switch (m_textureSpec.type)
		{
			case TEXTURETYPE_3D:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << "x" << testSize.textureSize.z() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << "x" << testSize.expectedSize.z() << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			case TEXTURETYPE_2D:
			case TEXTURETYPE_CUBE_MAP:
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << TestLog::EndMessage;

				gl.uniform2iv(sizeLoc, 1, testSize.expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage2D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y());
				break;
			}

			case TEXTURETYPE_2D_ARRAY:
			{
				tcu::IVec3 expectedSize(testSize.expectedSize.x(), testSize.expectedSize.y(), testSize.textureSize.z());

				m_context.getTestContext().getLog() << TestLog::Message << "Testing image size " << testSize.textureSize.x() << "x" << testSize.textureSize.y() << " with " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Lod: " << testSize.lod << ", base level: " << testSize.lodBase << TestLog::EndMessage;
				m_context.getTestContext().getLog() << TestLog::Message << "Expecting: " << testSize.expectedSize.x() << "x" << testSize.expectedSize.y() << " and " << testSize.textureSize.z() << " layer(s)" << TestLog::EndMessage;

				gl.uniform3iv(sizeLoc, 1, expectedSize.m_data);
				gl.uniform1iv(lodLoc,  1, &testSize.lod);

				gl.texStorage3D(textureTarget, levels, m_textureSpec.format, testSize.textureSize.x(), testSize.textureSize.y(), testSize.textureSize.z());
				break;
			}

			default:
			{
				DE_ASSERT(false);
				break;
			}
		}

		errorValue = gl.getError();
		if (errorValue == GL_OUT_OF_MEMORY)
		{
			throw glu::OutOfMemoryError("Failed to allocate texture, got GL_OUT_OF_MEMORY.", "TexStorageXD", __FILE__, __LINE__);
		}
		else if (errorValue != GL_NO_ERROR)
		{
			// error is a failure too
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failed, got " << glu::getErrorStr(errorValue) << "." << tcu::TestLog::EndMessage;
			success = false;
		}
		else
		{
			// test
			const float			colorTolerance = 0.1f;
			tcu::TextureLevel	sample			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1);
			tcu::Vec4			outputColor;

			gl.clear			(GL_COLOR_BUFFER_BIT);
			gl.drawArrays		(GL_TRIANGLES, 0, 3);
			gl.finish			();

			glu::readPixels		(m_context.getRenderContext(), 0, 0, sample.getAccess());

			outputColor = sample.getAccess().getPixel(0, 0);

			if (outputColor.x() >= 1.0f - colorTolerance &&
				outputColor.y() >= 1.0f - colorTolerance &&
				outputColor.z() >= 1.0f - colorTolerance)
			{
				// success
				m_context.getTestContext().getLog() << TestLog::Message << "Passed" << TestLog::EndMessage;
			}
			else
			{
				// failure
				m_context.getTestContext().getLog() << TestLog::Message << "Failed" << TestLog::EndMessage;
				success = false;
			}
		}

		// empty line to format log nicely
		m_context.getTestContext().getLog() << TestLog::Message << TestLog::EndMessage;

		// free
		gl.bindTexture		(textureTarget, 0);
		gl.deleteTextures	(1, &texId);
	}

	gl.useProgram(0);

	return success;
}